

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Music_Emu.cpp
# Opt level: O3

void __thiscall Music_Emu::unload(Music_Emu *this)

{
  this->voice_count_ = 0;
  this->current_track_ = -1;
  this->out_time = 0;
  this->emu_time = 0;
  this->emu_track_ended_ = true;
  this->track_ended_ = true;
  this->fade_start = 0x40000000;
  this->fade_step = 1;
  (this->super_Gme_File).warning_ = (char *)0x0;
  this->silence_time = 0;
  this->silence_count = 0;
  this->buf_remain = 0;
  Gme_File::unload(&this->super_Gme_File);
  return;
}

Assistant:

void Music_Emu::unload()
{
	voice_count_ = 0;
	clear_track_vars();
	Gme_File::unload();
}